

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_semaphore_init__posix(wchar_t initialValue,ma_semaphore *pSemaphore)

{
  wchar_t wVar1;
  wchar_t result;
  ma_semaphore *pSemaphore_local;
  wchar_t initialValue_local;
  
  if (pSemaphore == (ma_semaphore *)0x0) {
    pSemaphore_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    pSemaphore->value = initialValue;
    wVar1 = pthread_mutex_init((pthread_mutex_t *)&pSemaphore->lock,(pthread_mutexattr_t *)0x0);
    if (wVar1 == L'\0') {
      wVar1 = pthread_cond_init((pthread_cond_t *)&pSemaphore->cond,(pthread_condattr_t *)0x0);
      if (wVar1 == L'\0') {
        pSemaphore_local._4_4_ = MA_SUCCESS;
      }
      else {
        pthread_mutex_destroy((pthread_mutex_t *)&pSemaphore->lock);
        pSemaphore_local._4_4_ = ma_result_from_errno(wVar1);
      }
    }
    else {
      pSemaphore_local._4_4_ = ma_result_from_errno(wVar1);
    }
  }
  return pSemaphore_local._4_4_;
}

Assistant:

static ma_result ma_semaphore_init__posix(int initialValue, ma_semaphore* pSemaphore)
{
    int result;

    if (pSemaphore == NULL) {
        return MA_INVALID_ARGS;
    }

    pSemaphore->value = initialValue;

    result = pthread_mutex_init((pthread_mutex_t*)&pSemaphore->lock, NULL);
    if (result != 0) {
        return ma_result_from_errno(result);  /* Failed to create mutex. */
    }

    result = pthread_cond_init((pthread_cond_t*)&pSemaphore->cond, NULL);
    if (result != 0) {
        pthread_mutex_destroy((pthread_mutex_t*)&pSemaphore->lock);
        return ma_result_from_errno(result);  /* Failed to create condition variable. */
    }

    return MA_SUCCESS;
}